

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ObjFaninId2p(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (p->pMuxes != (uint *)0x0) {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar1 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
    if (uVar1 != 0) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = uVar1 >> 1;
    }
  }
  return uVar3;
}

Assistant:

static inline int          Gia_ObjFaninId2p( Gia_Man_t * p, Gia_Obj_t * pObj ) { return (p->pMuxes && p->pMuxes[Gia_ObjId(p, pObj)]) ? Abc_Lit2Var(p->pMuxes[Gia_ObjId(p, pObj)]) : -1; }